

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O0

void uavs3d_if_hor_chroma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  int local_5c;
  pel local_58;
  int local_54;
  int local_50;
  pel local_4c;
  int local_48;
  int valv;
  int valu;
  int sumv;
  int sumu;
  int col;
  int row;
  int height_local;
  int width_local;
  int i_dst_local;
  pel *dst_local;
  pel *ppStack_10;
  int i_src_local;
  pel *src_local;
  
  _width_local = dst;
  ppStack_10 = src;
  for (sumu = 0; sumu < height; sumu = sumu + 1) {
    for (sumv = 0; sumv < width; sumv = sumv + 2) {
      local_50 = (int)((uint)ppStack_10[sumv + -2] * (int)*coeff +
                       (uint)ppStack_10[sumv] * (int)coeff[1] +
                       (uint)ppStack_10[sumv + 2] * (int)coeff[2] +
                       (uint)ppStack_10[sumv + 4] * (int)coeff[3] + 0x20) >> 6;
      local_5c = (int)((uint)ppStack_10[sumv + -1] * (int)*coeff +
                       (uint)ppStack_10[sumv + 1] * (int)coeff[1] +
                       (uint)ppStack_10[sumv + 3] * (int)coeff[2] +
                       (uint)ppStack_10[sumv + 5] * (int)coeff[3] + 0x20) >> 6;
      local_48 = local_50;
      if (max_val < local_50) {
        local_48 = max_val;
      }
      if (local_48 < 0) {
        local_4c = '\0';
      }
      else {
        if (max_val < local_50) {
          local_50 = max_val;
        }
        local_4c = (pel)local_50;
      }
      _width_local[sumv] = local_4c;
      local_54 = local_5c;
      if (max_val < local_5c) {
        local_54 = max_val;
      }
      if (local_54 < 0) {
        local_58 = '\0';
      }
      else {
        if (max_val < local_5c) {
          local_5c = max_val;
        }
        local_58 = (pel)local_5c;
      }
      _width_local[sumv + 1] = local_58;
    }
    ppStack_10 = ppStack_10 + i_src;
    _width_local = _width_local + i_dst;
  }
  return;
}

Assistant:

static void uavs3d_if_hor_chroma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, s8 const *coeff, int max_val)
{
    int row, col;
    int sumu, sumv, valu, valv;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col += 2) {
            sumu = FLT_4TAP_HOR(src, col, coeff);
            sumv = FLT_4TAP_HOR(src, col + 1, coeff);
            valu = (sumu + 32) >> 6;
            valv = (sumv + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, valu);
            dst[col + 1] = COM_CLIP3(0, max_val, valv);
        }
        src += i_src;
        dst += i_dst;
    }
}